

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

string * testing::internal::XmlUnitTestResultPrinter::RemoveInvalidXmlCharacters
                   (string *__return_storage_ptr__,string *str)

{
  bool bVar1;
  size_type __res;
  uchar *puVar2;
  reference pcVar3;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  const_iterator it;
  string *str_local;
  string *output;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  __res = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size(str)
  ;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
            (__return_storage_ptr__,__res);
  local_38._M_current =
       (char *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               begin(str);
  while( true ) {
    local_40._M_current =
         (char *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 end(str);
    bVar1 = __gnu_cxx::
            operator==<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      (&local_38,&local_40);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    puVar2 = (uchar *)__gnu_cxx::
                      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator*(&local_38);
    bVar1 = IsValidXmlCharacter(*puVar2);
    if (bVar1) {
      pcVar3 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_38);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (__return_storage_ptr__,*pcVar3);
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string XmlUnitTestResultPrinter::RemoveInvalidXmlCharacters(
    const std::string& str) {
  std::string output;
  output.reserve(str.size());
  for (std::string::const_iterator it = str.begin(); it != str.end(); ++it)
    if (IsValidXmlCharacter(static_cast<unsigned char>(*it)))
      output.push_back(*it);

  return output;
}